

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_scan.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_stats_rowcol_scan
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  long lVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  undefined4 uVar10;
  parasail_result_t *ppVar11;
  int *ptr;
  int *ptr_00;
  int *ptr_01;
  int *ptr_02;
  int *ptr_03;
  int *ptr_04;
  int *ptr_05;
  int *ptr_06;
  int *ptr_07;
  int *ptr_08;
  int *ptr_09;
  int *ptr_10;
  int *ptr_11;
  int *ptr_12;
  int *ptr_13;
  long lVar12;
  int a;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  undefined4 uVar17;
  int *piVar18;
  ulong uVar19;
  size_t size;
  int iVar20;
  int iVar21;
  int iVar22;
  size_t size_00;
  ulong uVar23;
  int iVar24;
  uint uVar25;
  int *piVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  int local_108;
  uint local_104;
  int local_f0;
  int local_d8;
  int local_d4;
  int local_c4;
  
  if (_s2 == (char *)0x0) {
    parasail_sg_flags_stats_rowcol_scan_cold_8();
    return (parasail_result_t *)0x0;
  }
  if (s2Len < 1) {
    parasail_sg_flags_stats_rowcol_scan_cold_7();
    return (parasail_result_t *)0x0;
  }
  if (open < 0) {
    parasail_sg_flags_stats_rowcol_scan_cold_6();
    return (parasail_result_t *)0x0;
  }
  if (gap < 0) {
    parasail_sg_flags_stats_rowcol_scan_cold_5();
    return (parasail_result_t *)0x0;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sg_flags_stats_rowcol_scan_cold_4();
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 1) {
    if (_s1 == (char *)0x0) {
      parasail_sg_flags_stats_rowcol_scan_cold_3();
      return (parasail_result_t *)0x0;
    }
LAB_0055e454:
    uVar13 = (ulong)(uint)matrix->length;
  }
  else {
    if (_s1 == (char *)0x0) {
      parasail_sg_flags_stats_rowcol_scan_cold_2();
      return (parasail_result_t *)0x0;
    }
    uVar13 = (ulong)(uint)_s1Len;
    if (_s1Len < 1) {
      parasail_sg_flags_stats_rowcol_scan_cold_1();
      return (parasail_result_t *)0x0;
    }
    if (matrix->type != 0) goto LAB_0055e454;
  }
  a = (int)uVar13;
  ppVar11 = parasail_result_new_rowcol3(a,s2Len);
  if (ppVar11 == (parasail_result_t *)0x0) {
    return (parasail_result_t *)0x0;
  }
  ppVar11->flag =
       (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
       (uint)(s2_end != 0) << 0xf | ppVar11->flag | 0x1450202;
  size_00 = (size_t)a;
  ptr = parasail_memalign_int(0x10,size_00);
  uVar23 = (ulong)(uint)s2Len;
  ptr_00 = parasail_memalign_int(0x10,uVar23);
  size = (size_t)(a + 1);
  ptr_01 = parasail_memalign_int(0x10,size);
  ptr_02 = parasail_memalign_int(0x10,size);
  ptr_03 = parasail_memalign_int(0x10,size);
  ptr_04 = parasail_memalign_int(0x10,size);
  ptr_05 = parasail_memalign_int(0x10,size_00);
  ptr_06 = parasail_memalign_int(0x10,size_00);
  ptr_07 = parasail_memalign_int(0x10,size_00);
  ptr_08 = parasail_memalign_int(0x10,size_00);
  ptr_09 = parasail_memalign_int(0x10,size);
  ptr_10 = parasail_memalign_int(0x10,size);
  ptr_11 = parasail_memalign_int(0x10,size);
  ptr_12 = parasail_memalign_int(0x10,size);
  ptr_13 = parasail_memalign_int(0x10,size_00);
  auVar28._0_4_ = -(uint)((int)ptr == 0);
  auVar28._4_4_ = -(uint)((int)((ulong)ptr >> 0x20) == 0);
  auVar28._8_4_ = -(uint)((int)ptr_00 == 0);
  auVar28._12_4_ = -(uint)((int)((ulong)ptr_00 >> 0x20) == 0);
  auVar34._4_4_ = auVar28._0_4_;
  auVar34._0_4_ = auVar28._4_4_;
  auVar34._8_4_ = auVar28._12_4_;
  auVar34._12_4_ = auVar28._8_4_;
  auVar30._0_4_ = -(uint)((int)ptr_01 == 0);
  auVar30._4_4_ = -(uint)((int)((ulong)ptr_01 >> 0x20) == 0);
  auVar30._8_4_ = -(uint)((int)ptr_02 == 0);
  auVar30._12_4_ = -(uint)((int)((ulong)ptr_02 >> 0x20) == 0);
  auVar35._4_4_ = auVar30._0_4_;
  auVar35._0_4_ = auVar30._4_4_;
  auVar35._8_4_ = auVar30._12_4_;
  auVar35._12_4_ = auVar30._8_4_;
  auVar35 = packssdw(auVar34 & auVar28,auVar35 & auVar30);
  auVar32._0_4_ = -(uint)((int)ptr_03 == 0);
  auVar32._4_4_ = -(uint)((int)((ulong)ptr_03 >> 0x20) == 0);
  auVar32._8_4_ = -(uint)((int)ptr_04 == 0);
  auVar32._12_4_ = -(uint)((int)((ulong)ptr_04 >> 0x20) == 0);
  auVar27._4_4_ = auVar32._0_4_;
  auVar27._0_4_ = auVar32._4_4_;
  auVar27._8_4_ = auVar32._12_4_;
  auVar27._12_4_ = auVar32._8_4_;
  auVar33._0_4_ = -(uint)((int)ptr_05 == 0);
  auVar33._4_4_ = -(uint)((int)((ulong)ptr_05 >> 0x20) == 0);
  auVar33._8_4_ = -(uint)((int)ptr_06 == 0);
  auVar33._12_4_ = -(uint)((int)((ulong)ptr_06 >> 0x20) == 0);
  auVar31._4_4_ = auVar33._0_4_;
  auVar31._0_4_ = auVar33._4_4_;
  auVar31._8_4_ = auVar33._12_4_;
  auVar31._12_4_ = auVar33._8_4_;
  auVar28 = packssdw(auVar27 & auVar32,auVar31 & auVar33);
  auVar28 = packssdw(auVar35,auVar28);
  uVar2 = (ushort)(SUB161(auVar28 >> 0xf,0) & 1);
  uVar3 = (ushort)(SUB161(auVar28 >> 0x1f,0) & 1);
  uVar4 = (ushort)(SUB161(auVar28 >> 0x2f,0) & 1);
  uVar5 = (ushort)(SUB161(auVar28 >> 0x3f,0) & 1);
  uVar6 = (ushort)(SUB161(auVar28 >> 0x4f,0) & 1);
  uVar7 = (ushort)(SUB161(auVar28 >> 0x5f,0) & 1);
  uVar8 = (ushort)(SUB161(auVar28 >> 0x6f,0) & 1);
  uVar9 = (ushort)(byte)(auVar28[0xf] >> 7);
  if (((((((uVar2 != 0 || uVar3 != 0) || uVar4 != 0) || uVar5 != 0) || uVar6 != 0) || uVar7 != 0) ||
      uVar8 != 0) || uVar9 != 0) {
    return (parasail_result_t *)0x0;
  }
  auVar29._0_4_ = -(uint)((int)((ulong)ptr_07 >> 0x20) == 0 && (int)ptr_07 == 0);
  auVar29._4_4_ = -(uint)((int)ptr_08 == 0 && (int)((ulong)ptr_08 >> 0x20) == 0);
  auVar29._8_4_ = -(uint)((int)((ulong)ptr_09 >> 0x20) == 0 && (int)ptr_09 == 0);
  auVar29._12_4_ = -(uint)((int)ptr_10 == 0 && (int)((ulong)ptr_10 >> 0x20) == 0);
  uVar10 = movmskps((uint)(ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) | uVar2 << 1 |
                                   (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 | uVar3 << 3 |
                                   (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 | uVar4 << 5 |
                                   (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 | uVar5 << 7 |
                                   (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 | uVar6 << 9 |
                                   (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 | uVar7 << 0xb |
                                   (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc | uVar8 << 0xd |
                                   (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe | uVar9 << 0xf),
                    auVar29);
  if ((char)uVar10 != '\0') {
    return (parasail_result_t *)0x0;
  }
  if (ptr_11 == (int *)0x0) {
    return (parasail_result_t *)0x0;
  }
  if (ptr_12 == (int *)0x0) {
    return (parasail_result_t *)0x0;
  }
  if (ptr_13 == (int *)0x0) {
    return (parasail_result_t *)0x0;
  }
  if (0 < a) {
    piVar18 = matrix->mapper;
    uVar14 = 0;
    do {
      ptr[uVar14] = piVar18[(byte)_s1[uVar14]];
      uVar14 = uVar14 + 1;
    } while (uVar13 != uVar14);
  }
  piVar26 = ptr_04 + 1;
  piVar18 = matrix->mapper;
  uVar14 = 0;
  do {
    ptr_00[uVar14] = piVar18[(byte)_s2[uVar14]];
    uVar14 = uVar14 + 1;
  } while (uVar23 != uVar14);
  *ptr_01 = 0;
  *ptr_02 = 0;
  *ptr_03 = 0;
  *ptr_04 = 0;
  *ptr_09 = 0;
  if (s1_beg == 0) {
    if (a < 1) goto LAB_0055e840;
    iVar15 = -open;
    uVar14 = 0;
    do {
      ptr_01[uVar14 + 1] = iVar15;
      ptr_02[uVar14 + 1] = 0;
      ptr_03[uVar14 + 1] = 0;
      piVar26[uVar14] = 0;
      uVar14 = uVar14 + 1;
      iVar15 = iVar15 - gap;
    } while (uVar13 != uVar14);
  }
  else {
    if (a < 1) goto LAB_0055e840;
    uVar14 = 0;
    do {
      ptr_01[uVar14 + 1] = 0;
      ptr_02[uVar14 + 1] = 0;
      ptr_03[uVar14 + 1] = 0;
      piVar26[uVar14] = 0;
      uVar14 = uVar14 + 1;
    } while (uVar13 != uVar14);
  }
  if (0 < a) {
    uVar14 = 0;
    do {
      ptr_05[uVar14] = -0x40000000;
      ptr_06[uVar14] = 0;
      ptr_07[uVar14] = 0;
      ptr_08[uVar14] = 0;
      uVar14 = uVar14 + 1;
    } while (uVar13 != uVar14);
  }
LAB_0055e840:
  iVar15 = a + -1;
  lVar1 = uVar13 * 4;
  local_f0 = -0x40000000;
  uVar14 = 0;
  local_d8 = 0;
  local_d4 = 0;
  local_c4 = 0;
  local_108 = a;
  local_104 = s2Len;
  do {
    uVar25 = (uint)uVar14;
    if (a < 1) {
      iVar16 = -(uVar25 * gap + open);
      if (s2_beg != 0) {
        iVar16 = 0;
      }
      *ptr_09 = iVar16;
LAB_0055ec55:
      *ptr_01 = iVar16;
    }
    else {
      lVar12 = 0;
      do {
        iVar16 = *(int *)((long)ptr_01 + lVar12 + 4) - open;
        iVar20 = *(int *)((long)ptr_05 + lVar12) - gap;
        if (iVar20 < iVar16) {
          *(int *)((long)ptr_05 + lVar12) = iVar16;
          *(undefined4 *)((long)ptr_06 + lVar12) = *(undefined4 *)((long)ptr_02 + lVar12 + 4);
          *(undefined4 *)((long)ptr_07 + lVar12) = *(undefined4 *)((long)ptr_03 + lVar12 + 4);
          piVar18 = piVar26;
        }
        else {
          *(int *)((long)ptr_05 + lVar12) = iVar20;
          piVar18 = ptr_08;
        }
        *(int *)((long)ptr_08 + lVar12) = *(int *)((long)piVar18 + lVar12) + 1;
        lVar12 = lVar12 + 4;
      } while (lVar1 - lVar12 != 0);
      iVar16 = -(uVar25 * gap + open);
      if (s2_beg != 0) {
        iVar16 = 0;
      }
      *ptr_09 = iVar16;
      if (a < 1) goto LAB_0055ec55;
      piVar18 = matrix->matrix;
      uVar19 = 0;
      do {
        if (matrix->type == 0) {
          iVar20 = ptr[uVar19];
        }
        else {
          iVar20 = (int)uVar19;
        }
        iVar20 = piVar18[(long)(matrix->size * iVar20) + (long)ptr_00[uVar14]];
        iVar24 = ptr_01[uVar19] + iVar20;
        ptr_13[uVar19] = (uint)(iVar24 < ptr_05[uVar19]);
        if (iVar24 < ptr_05[uVar19]) {
          ptr_09[uVar19 + 1] = ptr_05[uVar19];
          ptr_10[uVar19 + 1] = ptr_06[uVar19];
          ptr_11[uVar19 + 1] = ptr_07[uVar19];
          iVar20 = ptr_08[uVar19];
        }
        else {
          ptr_09[uVar19 + 1] = iVar24;
          ptr_10[uVar19 + 1] = (uint)(ptr[uVar19] == ptr_00[uVar14]) + ptr_02[uVar19];
          ptr_11[uVar19 + 1] = (uint)(0 < iVar20) + ptr_03[uVar19];
          iVar20 = ptr_04[uVar19] + 1;
        }
        ptr_12[uVar19 + 1] = iVar20;
        uVar19 = uVar19 + 1;
      } while (uVar13 != uVar19);
      if (a < 1) goto LAB_0055ec55;
      iVar24 = -0x40000000;
      lVar12 = 0;
      iVar20 = 0;
      uVar17 = 0;
      uVar10 = 0;
      do {
        iVar21 = iVar24 - gap;
        iVar24 = *(int *)((long)ptr_09 + lVar12);
        if (*(int *)((long)ptr_09 + lVar12) <= iVar21) {
          iVar24 = iVar21;
        }
        if (iVar21 < *(int *)((long)ptr_01 + lVar12)) {
          uVar10 = *(undefined4 *)((long)ptr_02 + lVar12);
          uVar17 = *(undefined4 *)((long)ptr_03 + lVar12);
          iVar20 = *(int *)((long)ptr_04 + lVar12);
        }
        iVar22 = iVar24 - open;
        iVar20 = iVar20 + 1;
        iVar21 = *(int *)((long)ptr_09 + lVar12 + 4);
        if (iVar22 < iVar21) {
          *(int *)((long)ptr_01 + lVar12 + 4) = iVar21;
          *(undefined4 *)((long)ptr_02 + lVar12 + 4) = *(undefined4 *)((long)ptr_10 + lVar12 + 4);
          *(undefined4 *)((long)ptr_03 + lVar12 + 4) = *(undefined4 *)((long)ptr_11 + lVar12 + 4);
          iVar21 = *(int *)((long)ptr_12 + lVar12 + 4);
        }
        else {
          *(int *)((long)ptr_01 + lVar12 + 4) = iVar22;
          iVar21 = iVar20;
          if (*(int *)((long)ptr_09 + lVar12 + 4) == iVar22) {
            if (*(int *)((long)ptr_13 + lVar12) == 0) {
              *(undefined4 *)((long)ptr_02 + lVar12 + 4) =
                   *(undefined4 *)((long)ptr_10 + lVar12 + 4);
              *(undefined4 *)((long)ptr_03 + lVar12 + 4) =
                   *(undefined4 *)((long)ptr_11 + lVar12 + 4);
              iVar21 = *(int *)((long)ptr_12 + lVar12 + 4);
            }
            else {
              *(undefined4 *)((long)ptr_02 + lVar12 + 4) = uVar10;
              *(undefined4 *)((long)ptr_03 + lVar12 + 4) = uVar17;
            }
          }
          else {
            *(undefined4 *)((long)ptr_02 + lVar12 + 4) = uVar10;
            *(undefined4 *)((long)ptr_03 + lVar12 + 4) = uVar17;
          }
        }
        *(int *)((long)piVar26 + lVar12) = iVar21;
        lVar12 = lVar12 + 4;
      } while (lVar1 - lVar12 != 0);
      *ptr_01 = iVar16;
      if (uVar14 == s2Len - 1U && 0 < a) {
        lVar12 = 0;
        do {
          *(undefined4 *)
           (*(long *)((long)((ppVar11->field_4).trace)->trace_del_table + 0x20) + lVar12) =
               *(undefined4 *)((long)ptr_01 + lVar12 + 4);
          *(undefined4 *)
           (*(long *)((long)((ppVar11->field_4).trace)->trace_del_table + 0x28) + lVar12) =
               *(undefined4 *)((long)ptr_02 + lVar12 + 4);
          *(undefined4 *)
           (*(long *)((long)((ppVar11->field_4).trace)->trace_del_table + 0x30) + lVar12) =
               *(undefined4 *)((long)ptr_03 + lVar12 + 4);
          *(undefined4 *)
           (*(long *)((long)((ppVar11->field_4).trace)->trace_del_table + 0x38) + lVar12) =
               *(undefined4 *)((long)piVar26 + lVar12);
          lVar12 = lVar12 + 4;
        } while (lVar1 - lVar12 != 0);
      }
    }
    *(int *)(*((ppVar11->field_4).trace)->trace_del_table + uVar14 * 4) = ptr_01[(long)iVar15 + 1];
    *(int *)(*(long *)((long)((ppVar11->field_4).trace)->trace_del_table + 8) + uVar14 * 4) =
         ptr_02[(long)iVar15 + 1];
    *(int *)(*(long *)((long)((ppVar11->field_4).trace)->trace_del_table + 0x10) + uVar14 * 4) =
         ptr_03[(long)iVar15 + 1];
    iVar16 = piVar26[iVar15];
    *(int *)(*(long *)((long)((ppVar11->field_4).trace)->trace_del_table + 0x18) + uVar14 * 4) =
         iVar16;
    if ((s2_end != 0) && (local_f0 < ptr_01[(long)iVar15 + 1])) {
      local_c4 = ptr_02[(long)iVar15 + 1];
      local_d4 = ptr_03[(long)iVar15 + 1];
      local_108 = iVar15;
      local_104 = uVar25;
      local_d8 = iVar16;
      local_f0 = ptr_01[(long)iVar15 + 1];
    }
    uVar14 = uVar14 + 1;
    if (uVar14 == uVar23) {
      if (s1_end == 0 || s2_end == 0) {
        if (s1_end != 0 && 0 < a) {
          uVar23 = 0;
          do {
            if (local_f0 < ptr_01[uVar23 + 1]) {
              local_c4 = ptr_02[uVar23 + 1];
              local_d4 = ptr_03[uVar23 + 1];
              local_d8 = piVar26[uVar23];
              local_108 = (int)uVar23;
              local_104 = s2Len - 1U;
              local_f0 = ptr_01[uVar23 + 1];
            }
            uVar23 = uVar23 + 1;
          } while (uVar13 != uVar23);
        }
      }
      else if (0 < a) {
        uVar23 = 0;
        do {
          iVar15 = ptr_01[uVar23 + 1];
          if ((local_f0 < iVar15) ||
             (((iVar15 == local_f0 && (local_104 == s2Len - 1U)) &&
              (iVar15 = local_f0, (long)uVar23 < (long)local_108)))) {
            local_c4 = ptr_02[uVar23 + 1];
            local_d4 = ptr_03[uVar23 + 1];
            local_d8 = piVar26[uVar23];
            local_108 = (int)uVar23;
            local_104 = s2Len - 1U;
            local_f0 = iVar15;
          }
          uVar23 = uVar23 + 1;
        } while (uVar13 != uVar23);
      }
      if (s2_end == 0 && s1_end == 0) {
        local_108 = a + -1;
        local_f0 = ptr_01[size_00];
        local_c4 = ptr_02[size_00];
        local_d4 = ptr_03[size_00];
        local_d8 = ptr_04[size_00];
        local_104 = s2Len - 1;
      }
      ppVar11->score = local_f0;
      ppVar11->end_query = local_108;
      ppVar11->end_ref = local_104;
      ((ppVar11->field_4).stats)->matches = local_c4;
      ((ppVar11->field_4).stats)->similar = local_d4;
      ((ppVar11->field_4).stats)->length = local_d8;
      parasail_free(ptr_13);
      parasail_free(ptr_12);
      parasail_free(ptr_11);
      parasail_free(ptr_10);
      parasail_free(ptr_09);
      parasail_free(ptr_08);
      parasail_free(ptr_07);
      parasail_free(ptr_06);
      parasail_free(ptr_05);
      parasail_free(ptr_04);
      parasail_free(ptr_03);
      parasail_free(ptr_02);
      parasail_free(ptr_01);
      parasail_free(ptr_00);
      parasail_free(ptr);
      return ppVar11;
    }
  } while( true );
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    parasail_result_t *result = NULL;
    int * restrict s1 = NULL;
    int * restrict s2 = NULL;
    int * restrict HB = NULL;
    int * restrict H = NULL;
    int * restrict HMB = NULL;
    int * restrict HM = NULL;
    int * restrict HSB = NULL;
    int * restrict HS = NULL;
    int * restrict HLB = NULL;
    int * restrict HL = NULL;
    int * restrict E = NULL;
    int * restrict EM = NULL;
    int * restrict ES = NULL;
    int * restrict EL = NULL;
    int * restrict HtB = NULL;
    int * restrict Ht = NULL;
    int * restrict HtMB = NULL;
    int * restrict HtM = NULL;
    int * restrict HtSB = NULL;
    int * restrict HtS = NULL;
    int * restrict HtLB = NULL;
    int * restrict HtL = NULL;
    int * restrict Ex = NULL;
    int i = 0;
    int j = 0;
    int s1Len = 0;
    int score = 0;
    int matches = 0;
    int similar = 0;
    int length = 0;
    int end_query = 0;
    int end_ref = 0;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    i = 0;
    j = 0;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    score = NEG_INF_32;
    matches = 0;
    similar = 0;
    length = 0;
    end_query = s1Len;
    end_ref = s2Len;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_NOVEC_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_INT | PARASAIL_FLAG_LANES_1;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1 = parasail_memalign_int(16, s1Len);
    s2 = parasail_memalign_int(16, s2Len);
    HB = parasail_memalign_int(16, s1Len+1);
    H  = HB+1;
    HMB = parasail_memalign_int(16, s1Len+1);
    HM  = HMB+1;
    HSB = parasail_memalign_int(16, s1Len+1);
    HS  = HSB+1;
    HLB = parasail_memalign_int(16, s1Len+1);
    HL  = HLB+1;
    E  = parasail_memalign_int(16, s1Len);
    EM = parasail_memalign_int(16, s1Len);
    ES = parasail_memalign_int(16, s1Len);
    EL = parasail_memalign_int(16, s1Len);
    HtB= parasail_memalign_int(16, s1Len+1);
    Ht = HtB+1;
    HtMB= parasail_memalign_int(16, s1Len+1);
    HtM = HtMB+1;
    HtSB= parasail_memalign_int(16, s1Len+1);
    HtS = HtSB+1;
    HtLB= parasail_memalign_int(16, s1Len+1);
    HtL = HtLB+1;
    Ex = parasail_memalign_int(16, s1Len);

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2) return NULL;
    if (!HB) return NULL;
    if (!HMB) return NULL;
    if (!HSB) return NULL;
    if (!HLB) return NULL;
    if (!E) return NULL;
    if (!EM) return NULL;
    if (!ES) return NULL;
    if (!EL) return NULL;
    if (!HtB) return NULL;
    if (!HtMB) return NULL;
    if (!HtSB) return NULL;
    if (!HtLB) return NULL;
    if (!Ex) return NULL;

    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }

    /* initialize H,HM,HS,HL */
    H[-1] = 0;
    HM[-1] = 0;
    HS[-1] = 0;
    HL[-1] = 0;
    Ht[-1] = 0;
    if (s1_beg) {
        for (i=0; i<s1Len; ++i) {
            H[i] = 0;
            HM[i] = 0;
            HS[i] = 0;
            HL[i] = 0;
        }
    }
    else {
        for (i=0; i<s1Len; ++i) {
            H[i] = -open -i*gap;
            HM[i] = 0;
            HS[i] = 0;
            HL[i] = 0;
        }
    }

    /* initialize E */
    for (i=0; i<s1Len; ++i) {
        E[i] = NEG_INF_32;
        EM[i] = 0;
        ES[i] = 0;
        EL[i] = 0;
    }

    /* iterate over database */
    for (j=0; j<s2Len; ++j) {
        int Ft = NEG_INF_32;
        int FtM = 0;
        int FtS = 0;
        int FtL = 0;
        /* calculate E */
        for (i=0; i<s1Len; ++i) {
            int E_opn = H[i]-open;
            int E_ext = E[i]-gap;
            if (E_opn > E_ext) {
                E[i] = E_opn;
                EM[i] = HM[i];
                ES[i] = HS[i];
                EL[i] = HL[i];
            }
            else {
                E[i] = E_ext;
            }
            EL[i] += 1;
        }
        /* calculate Ht */
        Ht[-1] = s2_beg ? 0 : (-open -j*gap);
        for (i=0; i<s1Len; ++i) {
            int matval = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
                         matrix->matrix[matrix->size*s1[i]+s2[j]] :
                         matrix->matrix[matrix->size*i+s2[j]];
            int H_dag = H[i-1]+matval;
            Ex[i] = (E[i] > H_dag);
            if (H_dag >= E[i]) {
                Ht[i] = H_dag;
                HtM[i] = HM[i-1] + (s1[i]==s2[j]);
                HtS[i] = HS[i-1] + (matval > 0);
                HtL[i] = HL[i-1] + 1;
            }
            else {
                Ht[i] = E[i];
                HtM[i] = EM[i];
                HtS[i] = ES[i];
                HtL[i] = EL[i];
            }
        }
        /* calculate H,HM,HS,HL */
        for (i=0; i<s1Len; ++i) {
            int Ft_opn;
            int Ht_pre = Ht[i-1];
            int Ft_ext = Ft-gap;
            if (Ht_pre >= Ft_ext) {
                Ft = Ht_pre;
            }
            else {
                Ft = Ft_ext;
            }
            Ft_opn = Ft-open;
            if (H[i-1] > Ft_ext) {
                FtM = HM[i-1];
                FtS = HS[i-1];
                FtL = HL[i-1];
            }
            FtL += 1;
            if (Ht[i] > Ft_opn) {
                H[i] = Ht[i];
                HM[i] = HtM[i];
                HS[i] = HtS[i];
                HL[i] = HtL[i];
            }
            else {
                H[i] = Ft_opn;
                if (Ht[i] == Ft_opn) {
                    if (Ex[i]) {
                        /* we favor F/up/del when F and E scores tie */
                        HM[i] = FtM;
                        HS[i] = FtS;
                        HL[i] = FtL;
                    }
                    else {
                        HM[i] = HtM[i];
                        HS[i] = HtS[i];
                        HL[i] = HtL[i];
                    }
                }
                else {
                    HM[i] = FtM;
                    HS[i] = FtS;
                    HL[i] = FtL;
                }
            }
#ifdef PARASAIL_TABLE
            result->stats->tables->score_table[1LL*i*s2Len + j] = H[i];
            result->stats->tables->matches_table[1LL*i*s2Len + j] = HM[i];
            result->stats->tables->similar_table[1LL*i*s2Len + j] = HS[i];
            result->stats->tables->length_table[1LL*i*s2Len + j] = HL[i];
#endif
        }
        H[-1] = s2_beg ? 0 : (-open - j*gap);
#ifdef PARASAIL_ROWCOL
        if (j == s2Len-1) {
            for (i=0; i<s1Len; ++i) {
                result->stats->rowcols->score_col[i] = H[i];
                result->stats->rowcols->matches_col[i] = HM[i];
                result->stats->rowcols->similar_col[i] = HS[i];
                result->stats->rowcols->length_col[i] = HL[i];
            }
        }
        result->stats->rowcols->score_row[j] = H[s1Len-1];
        result->stats->rowcols->matches_row[j] = HM[s1Len-1];
        result->stats->rowcols->similar_row[j] = HS[s1Len-1];
        result->stats->rowcols->length_row[j] = HL[s1Len-1];
#endif
        /* last value from column */
        if (s2_end && H[s1Len-1] > score) {
            score = H[s1Len-1];
            matches = HM[s1Len-1];
            similar = HS[s1Len-1];
            length = HL[s1Len-1];
            end_query = s1Len-1;
            end_ref = j;
        }
    }
    /* max of last column */
    if (s1_end && s2_end) {
        for (i=0; i<s1Len; ++i) {
            if (H[i] > score) {
                score = H[i];
                matches = HM[i];
                similar = HS[i];
                length = HL[i];
                end_query = i;
                end_ref = s2Len-1;
            }
            else if (H[i] == score && end_ref == s2Len-1 && i < end_query) {
                matches = HM[i];
                similar = HS[i];
                length = HL[i];
                end_query = i;
                end_ref = s2Len-1;
            }
        }
    }
    else if (s1_end) {
        for (i=0; i<s1Len; ++i) {
            if (H[i] > score) {
                score = H[i];
                matches = HM[i];
                similar = HS[i];
                length = HL[i];
                end_query = i;
                end_ref = s2Len-1;
            }
        }
    }
    if (!s1_end && !s2_end) {
        score = H[s1Len-1];
        matches = HM[s1Len-1];
        similar = HS[s1Len-1];
        length = HL[s1Len-1];
        end_query = s1Len-1;
        end_ref = s2Len-1;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(Ex);
    parasail_free(HtLB);
    parasail_free(HtSB);
    parasail_free(HtMB);
    parasail_free(HtB);
    parasail_free(EL);
    parasail_free(ES);
    parasail_free(EM);
    parasail_free(E);
    parasail_free(HLB);
    parasail_free(HSB);
    parasail_free(HMB);
    parasail_free(HB);
    parasail_free(s2);
    parasail_free(s1);

    return result;
}